

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermOut.cpp
# Opt level: O3

void __thiscall
glslang::TOutputTraverser::visitConstantUnion(TOutputTraverser *this,TIntermConstantUnion *node)

{
  OutputTreeText(this->infoSink,(TIntermNode *)node,(this->super_TIntermTraverser).depth);
  TInfoSinkBase::append(&this->infoSink->debug,"Constant:\n");
  OutputConstantUnion(this->infoSink,&node->super_TIntermTyped,&node->constArray,this->extraOutput,
                      (this->super_TIntermTraverser).depth + 1);
  return;
}

Assistant:

void TOutputTraverser::visitConstantUnion(TIntermConstantUnion* node)
{
    OutputTreeText(infoSink, node, depth);
    infoSink.debug << "Constant:\n";

    OutputConstantUnion(infoSink, node, node->getConstArray(), extraOutput, depth + 1);
}